

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall libsbox::Stream::use_pipe(Stream *this,Pipe *pipe)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Pipe *local_18;
  Pipe *pipe_local;
  Stream *this_local;
  
  local_18 = pipe;
  pipe_local = (Pipe *)this;
  __rhs = Pipe::get_name_abi_cxx11_(pipe);
  std::operator+(&local_38,"@",__rhs);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Stream::use_pipe(const Pipe &pipe) {
    filename_ = "@" + pipe.get_name();
}